

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QByteArray *
QTimeZonePrivate::windowsIdToDefaultIanaId(QByteArray *__return_storage_ptr__,QByteArray *windowsId)

{
  bool bVar1;
  WindowsData *this;
  long in_FS_OFFSET;
  QByteArrayView local_48;
  QByteArrayView local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = std::
         __lower_bound<QtTimeZoneCldr::WindowsData_const*,QByteArray,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(QtTimeZoneCldr::WindowsData,QByteArrayView)noexcept>>
                   ((WindowsData *)&QtTimeZoneCldr::windowsDataTable,(WindowsData *)&DAT_00533ed4,
                    windowsId,
                    (_Iter_comp_val<bool_(*)(QtTimeZoneCldr::WindowsData,_QByteArrayView)_noexcept>)
                    0x3ac50d);
  if (this != (WindowsData *)&DAT_00533ed4) {
    local_38 = QtTimeZoneCldr::WindowsData::windowsId(this);
    local_48.m_data = (windowsId->d).ptr;
    local_48.m_size = (windowsId->d).size;
    bVar1 = ::comparesEqual(&local_38,&local_48);
    if (bVar1) {
      local_38 = QtTimeZoneCldr::WindowsData::ianaId(this);
      QByteArrayView::toByteArray(__return_storage_ptr__,&local_38);
      goto LAB_003ac4e9;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_003ac4e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZonePrivate::windowsIdToDefaultIanaId(const QByteArray &windowsId)
{
    const auto data = std::lower_bound(std::begin(windowsDataTable), std::end(windowsDataTable),
                                       windowsId, earlierWindowsId);
    if (data != std::end(windowsDataTable) && data->windowsId() == windowsId) {
        QByteArrayView id = data->ianaId();
        Q_ASSERT(id.indexOf(' ') == -1);
        return id.toByteArray();
    }
    return QByteArray();
}